

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFNumberTreeObjectHelper::iterator::iterator(iterator *this,shared_ptr<NNTreeIterator> *i)

{
  this->_vptr_iterator = (_func_int **)&PTR__iterator_002af938;
  std::__shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->impl).super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>,
             &i->super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>);
  (this->ivalue).first = 0;
  (this->ivalue).second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->ivalue).second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

QPDFNumberTreeObjectHelper::iterator::iterator(std::shared_ptr<NNTreeIterator> const& i) :
    impl(i)
{
}